

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visitStringEncode
          (Flow *__return_storage_ptr__,
          ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *this,StringEncode *curr)

{
  Name breakTo;
  Literals *a;
  bool bVar1;
  element_type *peVar2;
  size_t sVar3;
  ulong uVar4;
  Literal *pLVar5;
  Literal *this_00;
  Literal local_178;
  uint local_15c;
  ulong uStack_158;
  Index i;
  size_t end;
  Literals *arrayValues;
  Literals *strValues;
  uint64_t startVal;
  shared_ptr<wasm::GCData> arrayData;
  shared_ptr<wasm::GCData> strData;
  Flow start;
  Flow array;
  undefined1 local_78 [8];
  Flow str;
  StringEncode *curr_local;
  ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *this_local;
  
  if (*(int *)(curr + 0x10) == 1) {
    visit((Flow *)local_78,this,*(Expression **)(curr + 0x18));
    bVar1 = Flow::breaking((Flow *)local_78);
    if (bVar1) {
      Flow::Flow(__return_storage_ptr__,(Flow *)local_78);
    }
    else {
      visit((Flow *)&start.breakTo.super_IString.str._M_str,this,*(Expression **)(curr + 0x20));
      bVar1 = Flow::breaking((Flow *)&start.breakTo.super_IString.str._M_str);
      if (bVar1) {
        Flow::Flow(__return_storage_ptr__,(Flow *)&start.breakTo.super_IString.str._M_str);
      }
      else {
        visit((Flow *)&strData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,this,*(Expression **)(curr + 0x28));
        bVar1 = Flow::breaking((Flow *)&strData.
                                        super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
        if (bVar1) {
          Flow::Flow(__return_storage_ptr__,
                     (Flow *)&strData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
        }
        else {
          Flow::getSingleValue((Flow *)local_78);
          ::wasm::Literal::getGCData();
          Flow::getSingleValue((Flow *)&start.breakTo.super_IString.str._M_str);
          ::wasm::Literal::getGCData();
          bVar1 = std::__shared_ptr::operator_cast_to_bool
                            ((__shared_ptr *)
                             &arrayData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
          if ((!bVar1) ||
             (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&startVal), !bVar1))
          {
            (*this->_vptr_ExpressionRunner[2])(this,"null ref");
          }
          Flow::getSingleValue
                    ((Flow *)&strData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
          strValues = (Literals *)::wasm::Literal::getUnsigned();
          peVar2 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&arrayData.
                                    super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount);
          arrayValues = &peVar2->values;
          peVar2 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&startVal);
          a = strValues;
          end = (size_t)&peVar2->values;
          sVar3 = SmallVector<wasm::Literal,_1UL>::size
                            (&arrayValues->super_SmallVector<wasm::Literal,_1UL>);
          bVar1 = std::ckd_add<unsigned_long>(&stack0xfffffffffffffea8,(unsigned_long)a,sVar3);
          if ((bVar1) ||
             (sVar3 = SmallVector<wasm::Literal,_1UL>::size((SmallVector<wasm::Literal,_1UL> *)end),
             sVar3 < uStack_158)) {
            (*this->_vptr_ExpressionRunner[2])(this,"oob");
          }
          for (local_15c = 0; uVar4 = (ulong)local_15c,
              sVar3 = SmallVector<wasm::Literal,_1UL>::size
                                (&arrayValues->super_SmallVector<wasm::Literal,_1UL>), uVar4 < sVar3
              ; local_15c = local_15c + 1) {
            pLVar5 = SmallVector<wasm::Literal,_1UL>::operator[]
                               (&arrayValues->super_SmallVector<wasm::Literal,_1UL>,(ulong)local_15c
                               );
            this_00 = SmallVector<wasm::Literal,_1UL>::operator[]
                                ((SmallVector<wasm::Literal,_1UL> *)end,
                                 (long)(strValues->super_SmallVector<wasm::Literal,_1UL>).fixed.
                                       _M_elems + ((ulong)local_15c - 8));
            ::wasm::Literal::operator=(this_00,pLVar5);
          }
          peVar2 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&arrayData.
                                    super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount);
          sVar3 = SmallVector<wasm::Literal,_1UL>::size
                            (&(peVar2->values).super_SmallVector<wasm::Literal,_1UL>);
          wasm::Literal::Literal(&local_178,(int32_t)sVar3);
          Flow::Flow(__return_storage_ptr__,&local_178);
          ::wasm::Literal::~Literal(&local_178);
          std::shared_ptr<wasm::GCData>::~shared_ptr((shared_ptr<wasm::GCData> *)&startVal);
          std::shared_ptr<wasm::GCData>::~shared_ptr
                    ((shared_ptr<wasm::GCData> *)
                     &arrayData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        Flow::~Flow((Flow *)&strData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
      }
      Flow::~Flow((Flow *)&start.breakTo.super_IString.str._M_str);
    }
    Flow::~Flow((Flow *)local_78);
  }
  else {
    str.breakTo.super_IString.str._M_str = NONCONSTANT_FLOW;
    breakTo.super_IString.str._M_str = _operator__;
    breakTo.super_IString.str._M_len = (size_t)NONCONSTANT_FLOW;
    Flow::Flow(__return_storage_ptr__,breakTo);
  }
  return __return_storage_ptr__;
}

Assistant:

Flow visitStringEncode(StringEncode* curr) {
    // For now we only support JS-style strings into arrays.
    if (curr->op != StringEncodeWTF16Array) {
      return Flow(NONCONSTANT_FLOW);
    }

    Flow str = visit(curr->str);
    if (str.breaking()) {
      return str;
    }
    Flow array = visit(curr->array);
    if (array.breaking()) {
      return array;
    }
    Flow start = visit(curr->start);
    if (start.breaking()) {
      return start;
    }

    auto strData = str.getSingleValue().getGCData();
    auto arrayData = array.getSingleValue().getGCData();
    if (!strData || !arrayData) {
      trap("null ref");
    }
    auto startVal = start.getSingleValue().getUnsigned();
    auto& strValues = strData->values;
    auto& arrayValues = arrayData->values;
    size_t end;
    if (std::ckd_add<size_t>(&end, startVal, strValues.size()) ||
        end > arrayValues.size()) {
      trap("oob");
    }

    for (Index i = 0; i < strValues.size(); i++) {
      arrayValues[startVal + i] = strValues[i];
    }

    return Literal(int32_t(strData->values.size()));
  }